

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTryTableExpr
          (BinaryReaderIR *this,Type sig_type,CatchClauseVector *catches)

{
  Index IVar1;
  __single_object this_00;
  bool bVar2;
  pointer context;
  size_type __n;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_220;
  Enum local_214;
  Location local_210;
  Var local_1f0;
  Location local_1a8;
  Var local_188;
  Location local_140;
  undefined1 local_120 [8];
  TableCatch catch_;
  CatchClause *raw_catch;
  const_iterator __end2;
  const_iterator __begin2;
  CatchClauseVector *__range2;
  ExprList *expr_list;
  TryTableExpr *expr;
  __single_object expr_ptr;
  CatchClauseVector *catches_local;
  BinaryReaderIR *this_local;
  Type sig_type_local;
  
  expr_ptr._M_t.super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>.
  super__Head_base<0UL,_wabt::TryTableExpr_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>,_true,_true>)
       (__uniq_ptr_data<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>,_true,_true>)
       catches;
  std::make_unique<wabt::TryTableExpr>();
  context = std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>::get
                      ((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_> *)
                       &expr);
  __n = std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>::size
                  ((vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_> *)
                   expr_ptr._M_t.
                   super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>
                   .super__Head_base<0UL,_wabt::TryTableExpr_*,_false>._M_head_impl);
  std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::reserve(&context->catches,__n);
  SetBlockDeclaration(this,&(context->block).decl,sig_type);
  this_00 = expr_ptr;
  __end2 = std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>::begin
                     ((vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_> *)
                      expr_ptr._M_t.
                      super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>
                      .super__Head_base<0UL,_wabt::TryTableExpr_*,_false>._M_head_impl);
  raw_catch = (CatchClause *)
              std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>::end
                        ((vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_> *)
                         this_00._M_t.
                         super___uniq_ptr_impl<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::TryTableExpr_*,_std::default_delete<wabt::TryTableExpr>_>
                         .super__Head_base<0UL,_wabt::TryTableExpr_*,_false>._M_head_impl);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wabt::CatchClause_*,_std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>_>
                                *)&raw_catch);
    if (!bVar2) break;
    catch_._176_8_ =
         __gnu_cxx::
         __normal_iterator<const_wabt::CatchClause_*,_std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>_>
         ::operator*(&__end2);
    Location::Location(&local_140);
    TableCatch::TableCatch((TableCatch *)local_120,&local_140);
    catch_.target.field_2._24_4_ = *(undefined4 *)catch_._176_8_;
    IVar1 = *(Index *)(catch_._176_8_ + 4);
    GetLocation(&local_1a8,this);
    Var::Var(&local_188,IVar1,&local_1a8);
    Var::operator=((Var *)((long)&catch_.loc.field_1 + 8),&local_188);
    Var::~Var(&local_188);
    IVar1 = *(Index *)(catch_._176_8_ + 8);
    GetLocation(&local_210,this);
    Var::Var(&local_1f0,IVar1,&local_210);
    Var::operator=((Var *)((long)&catch_.tag.field_2 + 0x18),&local_1f0);
    Var::~Var(&local_1f0);
    std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::push_back
              (&context->catches,(value_type *)local_120);
    TableCatch::~TableCatch((TableCatch *)local_120);
    __gnu_cxx::
    __normal_iterator<const_wabt::CatchClause_*,_std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>_>
    ::operator++(&__end2);
  }
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::TryTableExpr,std::default_delete<wabt::TryTableExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_220,
             (unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_> *)&expr);
  local_214 = (Enum)AppendExpr(this,&local_220);
  bVar2 = Failed((Result)local_214);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_220);
  if (bVar2) {
    Result::Result((Result *)&sig_type_local,Error);
  }
  else {
    (this->module_->features_used).exceptions = true;
    sig_type_local.enum_ = (Enum)PushLabel(this,TryTable,&(context->block).exprs,(Expr *)context);
  }
  std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>::~unique_ptr
            ((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_> *)&expr);
  return (Result)sig_type_local.enum_;
}

Assistant:

Result BinaryReaderIR::OnTryTableExpr(Type sig_type,
                                      const CatchClauseVector& catches) {
  auto expr_ptr = std::make_unique<TryTableExpr>();
  TryTableExpr* expr = expr_ptr.get();
  expr->catches.reserve(catches.size());
  SetBlockDeclaration(&expr->block.decl, sig_type);
  ExprList* expr_list = &expr->block.exprs;

  for (auto& raw_catch : catches) {
    TableCatch catch_;
    catch_.kind = raw_catch.kind;
    catch_.tag = Var(raw_catch.tag, GetLocation());
    catch_.target = Var(raw_catch.depth, GetLocation());
    expr->catches.push_back(std::move(catch_));
  }

  CHECK_RESULT(AppendExpr(std::move(expr_ptr)));
  module_->features_used.exceptions = true;
  return PushLabel(LabelType::TryTable, expr_list, expr);
}